

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndirectTest.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::IndirectDraw::iterate
          (TestStatus *__return_storage_ptr__,IndirectDraw *this)

{
  deInt32 *pdVar1;
  int *piVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  VkPrimitiveTopology VVar4;
  Context *this_00;
  TestLog *pTVar5;
  pointer pcVar6;
  pointer pcVar7;
  pointer pcVar8;
  DeviceInterface *pDVar9;
  SharedPtrStateBase *pSVar10;
  Allocation *pAVar11;
  pointer __dest;
  Buffer *pBVar12;
  Image *this_01;
  void *pvVar13;
  VkQueue pVVar14;
  TestStatus *pTVar15;
  bool bVar16;
  deUint32 dVar17;
  VkResult VVar18;
  pointer pcVar19;
  VkDevice pVVar20;
  Allocator *pAVar21;
  char *__s;
  TestError *this_02;
  uint uVar22;
  long lVar23;
  int y;
  size_t __n;
  int x;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  allocator<char> local_169;
  VkQueue local_168;
  undefined8 local_160;
  undefined4 local_158;
  TestStatus *local_150;
  TestLog *local_148;
  double local_140;
  double local_138;
  double local_130;
  VkSubmitInfo submitInfo;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  Texture2D referenceFrame;
  ConstPixelBufferAccess renderedFrame;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  
  this_00 = (this->super_DrawTestsBaseClass).super_TestInstance.m_context;
  pTVar5 = this_00->m_testCtx->m_log;
  local_168 = Context::getUniversalQueue(this_00);
  if (this->m_drawType == DRAW_TYPE_INDEXED) {
    VVar4 = (this->super_DrawTestsBaseClass).m_topology;
    if (VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      pvVar3 = &this->m_indirectBufferContents;
      pcVar6 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar7 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (pvVar3,(size_type)(pcVar6 + (0x14 - (long)pcVar7)));
      pcVar8 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar19 = pcVar6 + ((long)pcVar8 - (long)pcVar7);
      pcVar19[0] = '\x04';
      pcVar19[1] = '\0';
      pcVar19[2] = '\0';
      pcVar19[3] = '\0';
      pcVar19[4] = '\x01';
      pcVar19[5] = '\0';
      pcVar19[6] = '\0';
      pcVar19[7] = '\0';
      pcVar19[8] = '\x02';
      pcVar19[9] = '\0';
      pcVar19[10] = '\0';
      pcVar19[0xb] = '\0';
      pcVar19[0xc] = '\r';
      pcVar19[0xd] = '\0';
      pcVar19[0xe] = '\0';
      pcVar19[0xf] = '\0';
      pcVar6 = pcVar6 + (long)(pcVar8 + (0x10 - (long)pcVar7));
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar7 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (pvVar3,(size_type)(pcVar6 + (0x14 - (long)pcVar7)));
      pcVar8 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar19 = pcVar6 + ((long)pcVar8 - (long)pcVar7);
      pcVar19[0] = -4;
      pcVar19[1] = -1;
      pcVar19[2] = -1;
      pcVar19[3] = -1;
      pcVar19[4] = -2;
      pcVar19[5] = -1;
      pcVar19[6] = -1;
      pcVar19[7] = -1;
      pcVar19[8] = -0xb;
      pcVar19[9] = -1;
      pcVar19[10] = -1;
      pcVar19[0xb] = -1;
      pcVar19[0xc] = '\t';
      pcVar19[0xd] = '\0';
      pcVar19[0xe] = '\0';
      pcVar19[0xf] = '\0';
      pcVar6 = pcVar6 + (long)(pcVar8 + (0x10 - (long)pcVar7));
      pcVar6[0] = -7;
      pcVar6[1] = -1;
      pcVar6[2] = -1;
      pcVar6[3] = -1;
      lVar23 = (long)(this->m_indirectBufferContents).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish -
               (long)(this->m_indirectBufferContents).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_start;
      std::vector<char,_std::allocator<char>_>::resize(pvVar3,lVar23 + 0x14);
      pcVar19 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar24 = 4;
      uVar25 = 6;
    }
    else {
      if (VVar4 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x14d);
        goto LAB_006eb8f8;
      }
      pvVar3 = &this->m_indirectBufferContents;
      pcVar6 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar7 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (pvVar3,(size_type)(pcVar6 + (0x14 - (long)pcVar7)));
      pcVar8 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar19 = pcVar6 + ((long)pcVar8 - (long)pcVar7);
      pcVar19[0] = '\x03';
      pcVar19[1] = '\0';
      pcVar19[2] = '\0';
      pcVar19[3] = '\0';
      pcVar19[4] = '\x01';
      pcVar19[5] = '\0';
      pcVar19[6] = '\0';
      pcVar19[7] = '\0';
      pcVar19[8] = '\x02';
      pcVar19[9] = '\0';
      pcVar19[10] = '\0';
      pcVar19[0xb] = '\0';
      pcVar19[0xc] = '\r';
      pcVar19[0xd] = '\0';
      pcVar19[0xe] = '\0';
      pcVar19[0xf] = '\0';
      pcVar6 = pcVar6 + (long)(pcVar8 + (0x10 - (long)pcVar7));
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar7 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (pvVar3,(size_type)(pcVar6 + (0x14 - (long)pcVar7)));
      pcVar8 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar19 = pcVar6 + ((long)pcVar8 - (long)pcVar7);
      pcVar19[0] = -4;
      pcVar19[1] = -1;
      pcVar19[2] = -1;
      pcVar19[3] = -1;
      pcVar19[4] = -2;
      pcVar19[5] = -1;
      pcVar19[6] = -1;
      pcVar19[7] = -1;
      pcVar19[8] = -0xb;
      pcVar19[9] = -1;
      pcVar19[10] = -1;
      pcVar19[0xb] = -1;
      pcVar19[0xc] = '\t';
      pcVar19[0xd] = '\0';
      pcVar19[0xe] = '\0';
      pcVar19[0xf] = '\0';
      pcVar6 = pcVar6 + (long)(pcVar8 + (0x10 - (long)pcVar7));
      pcVar6[0] = -7;
      pcVar6[1] = -1;
      pcVar6[2] = -1;
      pcVar6[3] = -1;
      lVar23 = (long)(this->m_indirectBufferContents).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish -
               (long)(this->m_indirectBufferContents).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_start;
      std::vector<char,_std::allocator<char>_>::resize(pvVar3,lVar23 + 0x14);
      pcVar19 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar24 = 3;
      uVar25 = 5;
    }
    pcVar6 = pcVar19 + lVar23;
    *(undefined4 *)pcVar6 = uVar24;
    pcVar6[4] = '\x01';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    *(undefined4 *)(pcVar6 + 8) = uVar25;
    pcVar6[0xc] = '\r';
    pcVar6[0xd] = '\0';
    pcVar6[0xe] = '\0';
    pcVar6[0xf] = '\0';
    pcVar19 = pcVar19 + lVar23 + 0x10;
    pcVar19[0] = '\0';
    pcVar19[1] = '\0';
    pcVar19[2] = '\0';
    pcVar19[3] = '\0';
    dVar17 = 0x28;
LAB_006eb16c:
    this->m_strideInBuffer = dVar17;
  }
  else if (this->m_drawType == DRAW_TYPE_SEQUENTIAL) {
    VVar4 = (this->super_DrawTestsBaseClass).m_topology;
    if (VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      pvVar3 = &this->m_indirectBufferContents;
      pcVar19 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pcVar6 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (pvVar3,(size_type)(pcVar19 + (0x10 - (long)pcVar6)));
      pcVar19 = pcVar19 + ((long)(this->m_indirectBufferContents).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar6);
      pcVar19[0] = '\x04';
      pcVar19[1] = '\0';
      pcVar19[2] = '\0';
      pcVar19[3] = '\0';
      pcVar19[4] = '\x01';
      pcVar19[5] = '\0';
      pcVar19[6] = '\0';
      pcVar19[7] = '\0';
      pcVar19[8] = '\x02';
      pcVar19[9] = '\0';
      pcVar19[10] = '\0';
      pcVar19[0xb] = '\0';
      pcVar19[0xc] = '\0';
      pcVar19[0xd] = '\0';
      pcVar19[0xe] = '\0';
      pcVar19[0xf] = '\0';
      pcVar19 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pcVar6 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (pvVar3,(size_type)(pcVar19 + (0x10 - (long)pcVar6)));
      pcVar19 = pcVar19 + ((long)(this->m_indirectBufferContents).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar6);
      pcVar19[0] = -4;
      pcVar19[1] = -1;
      pcVar19[2] = -1;
      pcVar19[3] = -1;
      pcVar19[4] = -2;
      pcVar19[5] = -1;
      pcVar19[6] = -1;
      pcVar19[7] = -1;
      pcVar19[8] = -0xb;
      pcVar19[9] = -1;
      pcVar19[10] = -1;
      pcVar19[0xb] = -1;
      pcVar19[0xc] = -9;
      pcVar19[0xd] = -1;
      pcVar19[0xe] = -1;
      pcVar19[0xf] = -1;
      lVar23 = (long)(this->m_indirectBufferContents).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish -
               (long)(this->m_indirectBufferContents).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_start;
      std::vector<char,_std::allocator<char>_>::resize(pvVar3,lVar23 + 0x10);
      pcVar19 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar24 = 4;
      uVar25 = 6;
    }
    else {
      if (VVar4 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x111);
        goto LAB_006eb8f8;
      }
      pvVar3 = &this->m_indirectBufferContents;
      pcVar19 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pcVar6 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (pvVar3,(size_type)(pcVar19 + (0x10 - (long)pcVar6)));
      pcVar19 = pcVar19 + ((long)(this->m_indirectBufferContents).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar6);
      pcVar19[0] = '\x03';
      pcVar19[1] = '\0';
      pcVar19[2] = '\0';
      pcVar19[3] = '\0';
      pcVar19[4] = '\x01';
      pcVar19[5] = '\0';
      pcVar19[6] = '\0';
      pcVar19[7] = '\0';
      pcVar19[8] = '\x02';
      pcVar19[9] = '\0';
      pcVar19[10] = '\0';
      pcVar19[0xb] = '\0';
      pcVar19[0xc] = '\0';
      pcVar19[0xd] = '\0';
      pcVar19[0xe] = '\0';
      pcVar19[0xf] = '\0';
      pcVar19 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pcVar6 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (pvVar3,(size_type)(pcVar19 + (0x10 - (long)pcVar6)));
      pcVar19 = pcVar19 + ((long)(this->m_indirectBufferContents).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar6);
      pcVar19[0] = -4;
      pcVar19[1] = -1;
      pcVar19[2] = -1;
      pcVar19[3] = -1;
      pcVar19[4] = -2;
      pcVar19[5] = -1;
      pcVar19[6] = -1;
      pcVar19[7] = -1;
      pcVar19[8] = -0xb;
      pcVar19[9] = -1;
      pcVar19[10] = -1;
      pcVar19[0xb] = -1;
      pcVar19[0xc] = -9;
      pcVar19[0xd] = -1;
      pcVar19[0xe] = -1;
      pcVar19[0xf] = -1;
      lVar23 = (long)(this->m_indirectBufferContents).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish -
               (long)(this->m_indirectBufferContents).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_start;
      std::vector<char,_std::allocator<char>_>::resize(pvVar3,lVar23 + 0x10);
      pcVar19 = (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar24 = 3;
      uVar25 = 5;
    }
    pcVar19 = pcVar19 + lVar23;
    *(undefined4 *)pcVar19 = uVar24;
    pcVar19[4] = '\x01';
    pcVar19[5] = '\0';
    pcVar19[6] = '\0';
    pcVar19[7] = '\0';
    *(undefined4 *)(pcVar19 + 8) = uVar25;
    pcVar19[0xc] = '\0';
    pcVar19[0xd] = '\0';
    pcVar19[0xe] = '\0';
    pcVar19[0xf] = '\0';
    dVar17 = 0x20;
    goto LAB_006eb16c;
  }
  this->m_drawCount = 2;
  this->m_offsetInBuffer = 8;
  local_148 = pTVar5;
  DrawTestsBaseClass::beginRenderPass(&this->super_DrawTestsBaseClass);
  pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar9->_vptr_DeviceInterface[0x58])
            (pDVar9,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0);
  __n = (long)(this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
  pVVar20 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&referenceFrame,this->m_offsetInBuffer + __n,0x100,
             VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar21 = Context::getDefaultAllocator
                      ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&submitInfo,pDVar9,pVVar20,(VkBufferCreateInfo *)&referenceFrame,pAVar21,
             (MemoryRequirement)0x1);
  pSVar10 = (this->m_indirectBuffer).m_state;
  if (pSVar10 == (SharedPtrStateBase *)submitInfo.pNext) {
LAB_006eb2f8:
    if (submitInfo.pNext != (void *)0x0) {
      LOCK();
      piVar2 = (int *)((long)submitInfo.pNext + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        submitInfo._4_4_ = 0;
        (**(code **)(*submitInfo.pNext + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)submitInfo.pNext + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (submitInfo.pNext != (void *)0x0) {
          (**(code **)(*submitInfo.pNext + 8))();
        }
        submitInfo.pNext = (void *)0x0;
      }
    }
  }
  else {
    if (pSVar10 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar10->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_indirectBuffer).m_ptr = (Buffer *)0x0;
        (*((this->m_indirectBuffer).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_indirectBuffer).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar10 = (this->m_indirectBuffer).m_state;
        if (pSVar10 != (SharedPtrStateBase *)0x0) {
          (*pSVar10->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_indirectBuffer).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_indirectBuffer).m_ptr = (Buffer *)submitInfo._0_8_;
    (this->m_indirectBuffer).m_state = (SharedPtrStateBase *)submitInfo.pNext;
    if (submitInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)submitInfo.pNext + 8) = *(int *)((long)submitInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_indirectBuffer).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      goto LAB_006eb2f8;
    }
  }
  pvVar13 = (void *)CONCAT44(referenceFrame.m_height,referenceFrame.m_width);
  if (pvVar13 != (void *)0x0) {
    operator_delete(pvVar13,(long)referenceFrame.m_view.m_levels - (long)pvVar13);
  }
  pAVar11 = (((this->m_indirectBuffer).m_ptr)->m_allocation).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00d50278;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar11->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar11->m_offset;
  __dest = (pointer)pAVar11->m_hostPtr;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest;
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  memcpy(__dest,&this->m_junkData,this->m_offsetInBuffer);
  memcpy((void *)((long)&__dest->m_ptr + this->m_offsetInBuffer),
         (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start,__n);
  pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
  pVVar20 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  pBVar12 = (this->m_indirectBuffer).m_ptr;
  pAVar11 = (pBVar12->m_allocation).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00d50278;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar11->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar11->m_offset;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pAVar11->m_hostPtr;
  pAVar11 = (pBVar12->m_allocation).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo._0_8_ = &PTR__Allocation_00d50278;
  submitInfo.pNext = (void *)(pAVar11->m_memory).m_internal;
  submitInfo._16_8_ = pAVar11->m_offset;
  submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar11->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (pDVar9,pVVar20,
             (VkDeviceMemory)
             referenceFrame.super_TextureLevelPyramid.m_data.
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,submitInfo._16_8_,
             __n + this->m_offsetInBuffer);
  ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar9->_vptr_DeviceInterface[0x4c])
            (pDVar9,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawTestsBaseClass).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  if (this->m_drawType == DRAW_TYPE_INDEXED) {
    pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
    (*pDVar9->_vptr_DeviceInterface[0x57])
              (pDVar9,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->m_indexBuffer).m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0,1);
  }
  uVar22 = this->m_drawCount;
  if (this->m_isMultiDrawEnabled == 0) {
    if (uVar22 == 0) goto LAB_006eb573;
  }
  else if (uVar22 <= this->m_drawIndirectMaxCount) {
    lVar23 = 0x2d8;
    if (this->m_drawType != DRAW_TYPE_SEQUENTIAL) {
      if (this->m_drawType != DRAW_TYPE_INDEXED) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x183);
LAB_006eb8f8:
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      lVar23 = 0x2e0;
    }
    pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
    (**(code **)((long)pDVar9->_vptr_DeviceInterface + lVar23))
              (pDVar9,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->m_indirectBuffer).m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               this->m_offsetInBuffer,uVar22,this->m_strideInBuffer);
    goto LAB_006eb573;
  }
  uVar22 = 0;
  do {
    lVar23 = 0x2d8;
    if (this->m_drawType != DRAW_TYPE_SEQUENTIAL) {
      if (this->m_drawType != DRAW_TYPE_INDEXED) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x193);
        goto LAB_006eb8f8;
      }
      lVar23 = 0x2e0;
    }
    pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
    (**(code **)((long)pDVar9->_vptr_DeviceInterface + lVar23))
              (pDVar9,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->m_indirectBuffer).m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (ulong)(this->m_strideInBuffer * uVar22) + this->m_offsetInBuffer,1,0);
    uVar22 = uVar22 + 1;
  } while (uVar22 < this->m_drawCount);
LAB_006eb573:
  pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
  local_150 = __return_storage_ptr__;
  (*pDVar9->_vptr_DeviceInterface[0x76])
            (pDVar9,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar9->_vptr_DeviceInterface[0x4a])
            (pDVar9,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pVVar14 = local_168;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&(this->super_DrawTestsBaseClass).m_cmdBuffer;
  VVar18 = (*pDVar9->_vptr_DeviceInterface[2])(pDVar9,local_168,1);
  ::vk::checkResult(VVar18,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x1a6);
  pDVar9 = (this->super_DrawTestsBaseClass).m_vk;
  VVar18 = (*pDVar9->_vptr_DeviceInterface[3])(pDVar9,pVVar14);
  ::vk::checkResult(VVar18,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x1a8);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DrawTestsBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x100,0x100);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  if (0 < referenceFrame.m_height) {
    local_140 = (double)referenceFrame.m_height * 0.5;
    dVar26 = (double)referenceFrame.m_width * 0.5;
    y = 0;
    local_138 = dVar26;
    do {
      if (0 < referenceFrame.m_width) {
        dVar27 = (double)ABS((float)((double)y / local_140) + -1.0);
        x = 0;
        local_130 = dVar27;
        do {
          if ((dVar27 <= 0.3) && (ABS((float)((double)x / dVar26) + -1.0) <= 0.3)) {
            renderedFrame.m_format.order = R;
            renderedFrame.m_format.type = SNORM_INT8;
            renderedFrame.m_size.m_data[0] = 0x3f800000;
            renderedFrame.m_size.m_data[1] = 0x3f800000;
            tcu::PixelBufferAccess::setPixel
                      (referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x,y,0);
            dVar26 = local_138;
            dVar27 = local_130;
          }
          x = x + 1;
        } while (referenceFrame.m_width != x);
      }
      y = y + 1;
    } while (y != referenceFrame.m_height);
  }
  this_01 = (this->super_DrawTestsBaseClass).m_colorTargetImage.m_ptr;
  pAVar21 = Context::getDefaultAllocator
                      ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  local_158 = 0;
  local_160 = 0;
  Image::readSurface(&renderedFrame,this_01,local_168,pAVar21,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar16 = tcu::fuzzyCompare(local_148,"Result","Image comparison result",
                             &(referenceFrame.super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  pTVar15 = local_150;
  __s = qpGetTestResultName((uint)!bVar16);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_169);
  pTVar15->m_code = (uint)!bVar16;
  (pTVar15->m_description)._M_dataplus._M_p = (pointer)&(pTVar15->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar15->m_description,local_d8,local_d0 + (long)local_d8);
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar15;
}

Assistant:

tcu::TestStatus IndirectDraw::iterate (void)
{
	tcu::TestLog &log = m_context.getTestContext().getLog();
	const vk::VkQueue queue = m_context.getUniversalQueue();

	if (m_drawType == DRAW_TYPE_SEQUENTIAL)
	{
		switch (m_topology)
		{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		{
			vk::VkDrawIndirectCommand drawCommands[] =
			{
				{
					3,		//vertexCount
					1,		//instanceCount
					2,		//firstVertex
					0		//firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 }, // junk (stride)
				{
					3,		//vertexCount
					1,		//instanceCount
					5,		//firstVertex
					0		//firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			vk::VkDrawIndirectCommand drawCommands[] =
			{
				{
					4,		//vertexCount
					1,		//instanceCount
					2,		//firstVertex
					0		//firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 }, // junk (stride)
				{
					4,		//vertexCount
					1,		//instanceCount
					6,		//firstVertex
					0		//firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		default:
			TCU_FAIL("impossible");
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndirectCommand);
	}
	else if (m_drawType == DRAW_TYPE_INDEXED)
	{
		switch (m_topology)
		{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		{
			vk::VkDrawIndexedIndirectCommand drawCommands[] =
			{
				{
					3,					// indexCount
					1,					// instanceCount
					2,					// firstIndex
					VERTEX_OFFSET,		// vertexOffset
					0,					// firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 }, // junk (stride)
				{
					3,					// indexCount
					1,					// instanceCount
					5,					// firstIndex
					VERTEX_OFFSET,		// vertexOffset
					0,					// firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			vk::VkDrawIndexedIndirectCommand drawCommands[] =
			{
				{
					4,				// indexCount
					1,				// instanceCount
					2,				// firstIndex
					VERTEX_OFFSET,	// vertexOffset
					0,				// firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 }, // junk (stride)
				{
					4,				// indexCount
					1,				// instanceCount
					6,				// firstIndex
					VERTEX_OFFSET,	// vertexOffset
					0,				// firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		default:
			TCU_FAIL("impossible");
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndexedIndirectCommand);
	}

	m_drawCount			= 2;
	m_offsetInBuffer	= sizeof(m_junkData);

	beginRenderPass();

	const vk::VkDeviceSize vertexBufferOffset	= 0;
	const vk::VkBuffer vertexBuffer				= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	const vk::VkDeviceSize dataSize = m_indirectBufferContents.size();

	m_indirectBuffer = Buffer::createAndAlloc(	m_vk,
												m_context.getDevice(),
												BufferCreateInfo(dataSize + m_offsetInBuffer,
																 vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT),
												m_context.getDefaultAllocator(),
												vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indirectBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_junkData, static_cast<size_t>(m_offsetInBuffer));
	deMemcpy(ptr + m_offsetInBuffer, &m_indirectBufferContents[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk,
							   m_context.getDevice(),
							   m_indirectBuffer->getBoundMemory().getMemory(),
							   m_indirectBuffer->getBoundMemory().getOffset(),
							   dataSize + m_offsetInBuffer);

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	if (m_drawType == DRAW_TYPE_INDEXED)
	{
		m_vk.cmdBindIndexBuffer(*m_cmdBuffer, m_indexBuffer->object(), DE_NULL, vk::VK_INDEX_TYPE_UINT32);
	}

	if (m_isMultiDrawEnabled && m_drawCount <= m_drawIndirectMaxCount)
	{
		switch (m_drawType)
		{
			case DRAW_TYPE_SEQUENTIAL:
				m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			case DRAW_TYPE_INDEXED:
				m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			default:
				TCU_FAIL("impossible");
		}
	}
	else
	{
		for (deUint32 drawNdx = 0; drawNdx < m_drawCount; drawNdx++)
		{
			switch (m_drawType)
			{
				case DRAW_TYPE_SEQUENTIAL:
					m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				case DRAW_TYPE_INDEXED:
					m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				default:
					TCU_FAIL("impossible");
			}
		}
	}
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageCoordinates refCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refCoords.bottom	&&
				 yCoord <= refCoords.top	&&
				 xCoord >= refCoords.left	&&
				 xCoord <= refCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset					= { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

}